

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdManAddDsd(If_DsdMan_t *p,char *pDsd,word *pTruth,uchar *pPerm,int *pnSupp)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  int pMatches [2000];
  char *local_1f90;
  int aiStack_1f88 [12];
  int local_1f58 [2000];
  
  bVar1 = *pDsd;
  bVar5 = bVar1;
  local_1f90 = pDsd;
  if (bVar1 == 0x21) {
    local_1f90 = pDsd + 1;
    bVar5 = pDsd[1];
  }
  if (bVar5 == 0x31) {
    if (local_1f90[1] == '\0') {
      uVar7 = 1;
      goto LAB_00425de3;
    }
  }
  else if ((bVar5 == 0x30) && (local_1f90[1] == '\0')) {
    uVar7 = 0;
    goto LAB_00425de3;
  }
  cVar2 = local_1f90[bVar5 == 0x21];
  if ((byte)(cVar2 + 0x85U) < 0xe6) {
    if (bVar5 != 0) {
      lVar3 = 0;
      iVar4 = 0;
      do {
        local_1f58[lVar3] = 0;
        uVar7 = bVar5 - 0x28;
        if (uVar7 < 0x36) {
          if ((0x8000000100001U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_00425d89;
          if ((0x20000000400002U >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_00425d6c;
LAB_00425d78:
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + -1;
          local_1f58[aiStack_1f88[lVar6 + -1]] = (int)lVar3;
        }
        else {
LAB_00425d6c:
          if (bVar5 == 0x7b) {
LAB_00425d89:
            local_1f58[(long)iVar4 + -0xc] = (int)lVar3;
            if (10 < iVar4) {
              __assert_fail("nNested < DAU_MAX_VAR",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                            ,0x67d,"void If_DsdMergeMatches(char *, int *)");
            }
            iVar4 = iVar4 + 1;
          }
          else if (bVar5 == 0x7d) goto LAB_00425d78;
        }
        bVar5 = local_1f90[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (bVar5 != 0);
      if (iVar4 != 0) {
        __assert_fail("nNested == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x67f,"void If_DsdMergeMatches(char *, int *)");
      }
    }
    uVar7 = If_DsdManAddDsd_rec(local_1f90,&local_1f90,local_1f58,p,pTruth,pPerm,pnSupp);
  }
  else {
    iVar4 = *pnSupp;
    *pnSupp = iVar4 + 1;
    pPerm[iVar4] = cVar2 + 0x9f;
    uVar7 = 2;
  }
LAB_00425de3:
  return bVar1 == 0x21 ^ uVar7;
}

Assistant:

int If_DsdManAddDsd( If_DsdMan_t * p, char * pDsd, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    int iRes = -1, fCompl = 0;
    if ( *pDsd == '!' )
         pDsd++, fCompl = 1;
    if ( Dau_DsdIsConst0(pDsd) )
        iRes = 0;
    else if ( Dau_DsdIsConst1(pDsd) )
        iRes = 1;
    else if ( Dau_DsdIsVar(pDsd) )
    {
        pPerm[(*pnSupp)++] = Dau_DsdReadVar(pDsd);
        iRes = 2;
    }
    else
    {
        int pMatches[DAU_MAX_STR];
        If_DsdMergeMatches( pDsd, pMatches );
        iRes = If_DsdManAddDsd_rec( pDsd, &pDsd, pMatches, p, pTruth, pPerm, pnSupp );
    }
    return Abc_LitNotCond( iRes, fCompl );
}